

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

void curl_easy_cleanup(Curl_easy *data)

{
  undefined1 local_b0 [8];
  sigpipe_ignore pipe_st;
  Curl_easy *data_local;
  
  if (data != (Curl_easy *)0x0) {
    pipe_st._152_8_ = data;
    sigpipe_ignore(data,(sigpipe_ignore *)local_b0);
    Curl_close((Curl_easy *)pipe_st._152_8_);
    sigpipe_restore((sigpipe_ignore *)local_b0);
  }
  return;
}

Assistant:

void curl_easy_cleanup(struct Curl_easy *data)
{
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return;

  sigpipe_ignore(data, &pipe_st);
  Curl_close(data);
  sigpipe_restore(&pipe_st);
}